

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

void __thiscall
QItemSelectionModelPrivate::initModel(QItemSelectionModelPrivate *this,QAbstractItemModel *m)

{
  Connection *pCVar1;
  QAbstractItemModel *pQVar2;
  QObject *pQVar3;
  QObject *pQVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  QSlotObjectBase *pQVar8;
  long lVar9;
  long in_FS_OFFSET;
  void *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
  if (pQVar2 != m) {
    pQVar3 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
    if (pQVar2 != (QAbstractItemModel *)0x0) {
      (*pQVar3->_vptr_QObject[0x10])(pQVar3);
      lVar9 = 0;
      do {
        QObject::disconnect((Connection *)((long)&(this->connections)._M_elems[0].d_ptr + lVar9));
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x60);
    }
    (this->model).super_QPropertyData<QAbstractItemModel_*>.val = m;
    if (m != (QAbstractItemModel *)0x0) {
      local_a8 = QAbstractItemModel::rowsAboutToBeRemoved;
      local_a0 = 0;
      local_b8 = rowsAboutToBeRemoved;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(code **)(pQVar8 + 1) = rowsAboutToBeRemoved;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_98,&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::columnsAboutToBeRemoved;
      local_a0 = 0;
      local_b8 = columnsAboutToBeRemoved;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(code **)(pQVar8 + 1) = columnsAboutToBeRemoved;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_98 + 8),&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::rowsAboutToBeInserted;
      local_a0 = 0;
      local_b8 = rowsAboutToBeInserted;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(code **)(pQVar8 + 1) = rowsAboutToBeInserted;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_88,&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::columnsAboutToBeInserted;
      local_a0 = 0;
      local_b8 = columnsAboutToBeInserted;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(const_QModelIndex_&,_int,_int),_QtPrivate::List<const_QModelIndex_&,_int,_int>,_void>
           ::impl;
      *(code **)(pQVar8 + 1) = columnsAboutToBeInserted;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_88 + 8),&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::rowsAboutToBeMoved;
      local_a0 = 0;
      local_b8 = triggerLayoutToBeChanged;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar8 + 1) = triggerLayoutToBeChanged;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_78,&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::columnsAboutToBeMoved;
      local_a0 = 0;
      local_b8 = triggerLayoutToBeChanged;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar8 + 1) = triggerLayoutToBeChanged;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_78 + 8),&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::rowsMoved;
      local_a0 = 0;
      local_b8 = triggerLayoutChanged;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar8 + 1) = triggerLayoutChanged;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_68,&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::columnsMoved;
      local_a0 = 0;
      local_b8 = triggerLayoutChanged;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar8 + 1) = triggerLayoutChanged;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_68 + 8),&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::layoutAboutToBeChanged;
      local_a0 = 0;
      local_b8 = layoutAboutToBeChanged;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint),_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(code **)(pQVar8 + 1) = layoutAboutToBeChanged;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_58,&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QAbstractItemModel::layoutChanged;
      local_a0 = 0;
      local_b8 = layoutChanged;
      local_b0 = 0;
      pQVar4 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint),_QtPrivate::List<const_QList<QPersistentModelIndex>_&,_QAbstractItemModel::LayoutChangeHint>,_void>
           ::impl;
      *(code **)(pQVar8 + 1) = layoutChanged;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_58 + 8),&m->super_QObject,&local_a8,pQVar4,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_c8 = (void *)0x81;
      local_c0 = 0;
      local_a8 = QAbstractItemModel::modelReset;
      local_a0 = 0;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::QCallableObject<void_(QItemSelectionModel::*)(),_QtPrivate::List<>,_void>::
           impl;
      *(undefined8 *)(pQVar8 + 1) = 0x81;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)local_48,&m->super_QObject,&local_a8,pQVar3,&local_c8,pQVar8,
                 AutoConnection,(int *)0x0,&QAbstractItemModel::staticMetaObject);
      local_a8 = QObject::destroyed;
      local_a0 = 0;
      local_b8 = modelDestroyed;
      local_b0 = 0;
      pQVar3 = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
      pQVar8 = (QSlotObjectBase *)operator_new(0x20);
      (pQVar8->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar8->m_impl =
           QtPrivate::
           QPrivateSlotObject<void_(QItemSelectionModelPrivate::*)(),_QtPrivate::List<>,_void>::impl
      ;
      *(code **)(pQVar8 + 1) = modelDestroyed;
      pQVar8[1].m_impl = (ImplFn)0x0;
      QObject::connectImpl
                ((QObject *)(local_48 + 8),&m->super_QObject,&local_a8,pQVar3,&local_b8,pQVar8,
                 AutoConnection,(int *)0x0,&QObject::staticMetaObject);
      lVar9 = 0;
      do {
        pCVar1 = (this->connections)._M_elems + lVar9;
        pvVar5 = pCVar1->d_ptr;
        pvVar6 = pCVar1[1].d_ptr;
        pvVar7 = *(void **)(local_88 + lVar9 * 8 + -8);
        pCVar1 = (this->connections)._M_elems + lVar9;
        pCVar1->d_ptr = *(void **)(local_98 + lVar9 * 8);
        pCVar1[1].d_ptr = pvVar7;
        *(void **)(local_98 + lVar9 * 8) = pvVar5;
        *(void **)(local_88 + lVar9 * 8 + -8) = pvVar6;
        lVar9 = lVar9 + 2;
      } while (lVar9 != 0xc);
      lVar9 = 0x58;
      do {
        QMetaObject::Connection::~Connection((Connection *)(local_98 + lVar9));
        lVar9 = lVar9 + -8;
      } while (lVar9 != -8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::initModel(QAbstractItemModel *m)
{
    Q_Q(QItemSelectionModel);
    const QAbstractItemModel *oldModel = model.valueBypassingBindings();
    if (oldModel == m)
        return;

    if (oldModel) {
        q->reset();
        disconnectModel();
    }

    // Caller has to call notify(), unless calling during construction (the common case).
    model.setValueBypassingBindings(m);

    if (m) {
        connections = std::array<QMetaObject::Connection, 12> {
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeRemoved,
                                    this, &QItemSelectionModelPrivate::rowsAboutToBeRemoved),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeRemoved,
                                    this, &QItemSelectionModelPrivate::columnsAboutToBeRemoved),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeInserted,
                                    this, &QItemSelectionModelPrivate::rowsAboutToBeInserted),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeInserted,
                                    this, &QItemSelectionModelPrivate::columnsAboutToBeInserted),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsAboutToBeMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsAboutToBeMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::rowsMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::columnsMoved,
                                    this, &QItemSelectionModelPrivate::triggerLayoutChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::layoutAboutToBeChanged,
                                    this, &QItemSelectionModelPrivate::layoutAboutToBeChanged),
            QObjectPrivate::connect(m, &QAbstractItemModel::layoutChanged,
                                    this, &QItemSelectionModelPrivate::layoutChanged),
            QObject::connect(m, &QAbstractItemModel::modelReset,
                             q, &QItemSelectionModel::reset),
            QObjectPrivate::connect(m, &QAbstractItemModel::destroyed,
                                    this, &QItemSelectionModelPrivate::modelDestroyed)
        };
    }
}